

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NTSCD.cpp
# Opt level: O2

void __thiscall dg::llvmdg::legacy::NTSCD::visit(NTSCD *this,Block *node)

{
  unordered_map<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::NTSCD::NodeInfo,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>_>_>
  *this_00;
  mapped_type *pmVar1;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *psVar2;
  _Base_ptr p_Var3;
  Block *local_20;
  
  this_00 = &this->nodeInfo;
  local_20 = node;
  pmVar1 = std::__detail::
           _Map_base<dg::llvmdg::legacy::Block_*,_std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>_>,_std::__detail::_Select1st,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<dg::llvmdg::legacy::Block_*,_std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>_>,_std::__detail::_Select1st,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_20);
  if (pmVar1->outDegreeCounter != 0) {
    pmVar1 = std::__detail::
             _Map_base<dg::llvmdg::legacy::Block_*,_std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>_>,_std::__detail::_Select1st,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<dg::llvmdg::legacy::Block_*,_std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>_>,_std::__detail::_Select1st,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&local_20);
    pmVar1->outDegreeCounter = pmVar1->outDegreeCounter - 1;
    pmVar1 = std::__detail::
             _Map_base<dg::llvmdg::legacy::Block_*,_std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>_>,_std::__detail::_Select1st,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<dg::llvmdg::legacy::Block_*,_std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>_>,_std::__detail::_Select1st,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&local_20);
    if (pmVar1->outDegreeCounter == 0) {
      pmVar1 = std::__detail::
               _Map_base<dg::llvmdg::legacy::Block_*,_std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>_>,_std::__detail::_Select1st,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<dg::llvmdg::legacy::Block_*,_std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>_>,_std::__detail::_Select1st,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_20);
      pmVar1->red = true;
      psVar2 = Block::predecessors(local_20);
      for (p_Var3 = (psVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &(psVar2->_M_t)._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        visit(this,*(Block **)(p_Var3 + 1));
      }
    }
  }
  return;
}

Assistant:

void NTSCD::visit(Block *node) {
    if (nodeInfo[node].outDegreeCounter == 0) {
        return;
    }
    nodeInfo[node].outDegreeCounter--;
    if (nodeInfo[node].outDegreeCounter == 0) {
        nodeInfo[node].red = true;
        for (auto *predecessor : node->predecessors()) {
            visit(predecessor);
        }
    }
}